

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_external_fixups.hpp
# Opt level: O1

void compare_external_fixups<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
               (database *export_db,
               vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               *exported_fixups,database *import_db,
               vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               *imported_fixups)

{
  address __nbytes;
  size_t __nbytes_00;
  internal iVar1;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> nVar2;
  pointer peVar3;
  int __fd;
  char *pcVar4;
  _func_int **message;
  long lVar5;
  pointer peVar6;
  AssertionResult gtest_ar;
  shared_sstring_view import_owner;
  shared_sstring_view export_owner;
  AssertionResult gtest_ar_1;
  undefined1 local_110 [16];
  anon_union_8_2_d34ab9e4_for_indirect_string_3 local_100;
  sstring_view<std::shared_ptr<const_char>_> local_f8;
  undefined1 local_d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  size_type local_c8;
  raw_sstring_view local_b8;
  internal local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *local_98;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_90;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_88;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *local_80;
  pointer local_78;
  database *local_70;
  database *local_68;
  long local_60;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> local_58;
  raw_sstring_view local_40;
  
  local_f8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((long)(exported_fixups->
              super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(exported_fixups->
              super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5);
  local_d8 = (undefined1  [8])
             ((long)(imported_fixups->
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(imported_fixups->
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5);
  local_70 = export_db;
  local_68 = import_db;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_110,"exported_fixups.size ()","imported_fixups.size ()",
             (unsigned_long *)&local_f8,(unsigned_long *)local_d8);
  iVar1 = local_110[0];
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               ((long)local_f8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 0x10),
               "Expected the number of xfixups imported to match the number we started with",0x4b);
    if ((pointer)local_110._8_8_ == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)local_110._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/compare_external_fixups.hpp"
               ,0x21,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    if ((long *)local_f8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (long *)0x0) {
      (**(code **)(*(long *)local_f8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 8))();
    }
  }
  if ((pointer)local_110._8_8_ != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_110._8_8_);
  }
  if (iVar1 != (internal)0x0) {
    peVar6 = (exported_fixups->
             super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_78 = (exported_fixups->
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    local_98 = imported_fixups;
    local_80 = exported_fixups;
    if (peVar6 != local_78) {
      peVar3 = (imported_fixups->
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = 0;
      do {
        local_f8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_f8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_f8.size_ = 0;
        local_c8 = 0;
        local_d8 = (undefined1  [8])0x0;
        _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        __nbytes.a_ = (peVar3->name).a_.a_;
        local_88.ptr_ = &local_f8;
        local_60 = lVar5;
        pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::
        ensure_invariant(&local_88);
        nVar2.ptr_ = local_88.ptr_;
        __fd = (int)(indirect_string *)local_110;
        pstore::indirect_string::read(__fd,local_68,__nbytes.a_);
        local_b8 = pstore::indirect_string::as_string_view((indirect_string *)local_110,nVar2);
        __nbytes_00 = (peVar6->name).a_.a_;
        local_90.ptr_ = (sstring_view<std::shared_ptr<const_char>_> *)local_d8;
        pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::
        ensure_invariant(&local_90);
        nVar2.ptr_ = local_90.ptr_;
        pstore::indirect_string::read(__fd,local_70,__nbytes_00);
        local_40 = pstore::indirect_string::as_string_view((indirect_string *)local_110,nVar2);
        testing::internal::
        CmpHelperEQ<pstore::sstring_view<char_const*>,pstore::sstring_view<char_const*>>
                  (local_a8,"load_string (import_db, import_it->name, &import_owner)",
                   "load_string (export_db, export_it->name, &export_owner)",&local_b8,&local_40);
        lVar5 = local_60;
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_b8.ptr_ + 0x10),"Names of fixup #",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_b8.ptr_ + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_b8.ptr_ + 0x10),". exported name:",0x10);
          local_110._0_8_ = (peVar6->name).a_.a_;
          pstore::operator<<((ostream *)(local_b8.ptr_ + 0x10),(address *)local_110);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_b8.ptr_ + 0x10),", imported name:",0x10);
          local_110._0_8_ = (peVar3->name).a_.a_;
          pstore::operator<<((ostream *)(local_b8.ptr_ + 0x10),(address *)local_110);
          pcVar4 = "";
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_110,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/compare_external_fixups.hpp"
                     ,0x3a,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
          if ((long *)local_b8.ptr_ != (long *)0x0) {
            (**(code **)(*(long *)local_b8.ptr_ + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        (peVar3->name).a_.a_ = 0;
        (peVar6->name).a_.a_ = 0;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_d0._M_pi !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
        }
        if (local_f8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        peVar3 = peVar3 + 1;
        peVar6 = peVar6 + 1;
        lVar5 = lVar5 + 1;
      } while (peVar6 != local_78);
    }
    std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::vector
              ((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                *)local_110,local_80);
    std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::vector
              (&local_58,
               (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                *)local_110);
    if ((database *)local_110._0_8_ != (database *)0x0) {
      operator_delete((void *)local_110._0_8_,(long)local_100.str_ - local_110._0_8_);
    }
    std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::vector
              ((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                *)local_110,&local_58);
    std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::vector
              ((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                *)&local_f8,
               (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                *)local_110);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_110._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete((void *)local_110._0_8_,(long)local_100.str_ - local_110._0_8_);
    }
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
    ::operator()(local_d8,(char *)&local_f8,
                 (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                  *)"imported_fixups");
    if ((long *)local_f8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (long *)0x0) {
      operator_delete(local_f8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,local_f8.size_ -
                             (long)local_f8.ptr_.
                                   super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     );
    }
    if (local_58.
        super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d8[0] == '\0') {
      testing::Message::Message((Message *)local_110);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_110._0_8_ + 0x10),
                 "The imported and exported xfixups should match",0x2e);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_d0._M_pi ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (_func_int **)0x1ecb0f;
      }
      else {
        message = (_func_int **)((_Alloc_hider *)&(_Stack_d0._M_pi)->_vptr__Sp_counted_base)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/compare_external_fixups.hpp"
                 ,0x45,(char *)message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_110._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_d0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_d0._M_pi);
    }
  }
  return;
}

Assistant:

void compare_external_fixups (pstore::database const & export_db,
                              ExportsContainer & exported_fixups,
                              pstore::database const & import_db,
                              ImportsContainer & imported_fixups) {

    ASSERT_EQ (exported_fixups.size (), imported_fixups.size ())
        << "Expected the number of xfixups imported to match the number we started with";

    using string_address = pstore::typed_address<pstore::indirect_string>;

    auto const load_string = [] (pstore::database const & db, string_address const addr,
                                 pstore::gsl::not_null<pstore::shared_sstring_view *> const owner) {
        return pstore::indirect_string::read (db, addr).as_string_view (owner);
    };

    // The name fields are tricky here. The imported and exported fixups are from different
    // databases so we can't simply compare string addresses to find out if they point to the
    // same string. Instead we must load each of the strings and compare them directly.
    // However, we still want to use operator== for all of the other fields so that we don't
    // end up having to duplicate the rest of the comparison method here. Setting both name
    // fields to 0 after comparison allows us to do that.
    {
        auto import_it = std::begin (imported_fixups);
        auto export_it = std::begin (exported_fixups);
        auto const export_end = std::end (exported_fixups);
        auto count = std::size_t{0};
        for (; export_it != export_end; ++import_it, ++export_it, ++count) {
            pstore::shared_sstring_view import_owner;
            pstore::shared_sstring_view export_owner;
            EXPECT_EQ (load_string (import_db, import_it->name, &import_owner),
                       load_string (export_db, export_it->name, &export_owner))
                << "Names of fixup #" << count << ". exported name:" << export_it->name
                << ", imported name:" << import_it->name;

            // Set the import and export name values to the same address (it doesn't matter what
            // that address is). This will mean that differences won't cause failures as we
            // compare the two containers.
            export_it->name = import_it->name = string_address ();
        }
    }

    EXPECT_THAT (imported_fixups, testing::ContainerEq (exported_fixups))
        << "The imported and exported xfixups should match";
}